

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O1

int __thiscall ncnn::ExpandDims::load_param(ExpandDims *this,ParamDict *pd)

{
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  int iVar3;
  Mat local_98;
  Mat local_58;
  
  iVar3 = ParamDict::get(pd,0,0);
  this->expand_w = iVar3;
  iVar3 = ParamDict::get(pd,1,0);
  this->expand_h = iVar3;
  iVar3 = ParamDict::get(pd,2,0);
  this->expand_c = iVar3;
  local_58.elemsize._0_4_ = 0;
  local_58._20_8_ = 0;
  local_58.data = (void *)0x0;
  local_58.refcount._0_4_ = 0;
  local_58.refcount._4_4_ = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.c = 0;
  local_58.cstep = 0;
  ParamDict::get(&local_98,pd,3,&local_58);
  if (&this->axes != &local_98) {
    piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (this->axes).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = (this->axes).data;
        pAVar2 = (this->axes).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*(long *)pAVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->axes).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->axes).elemsize + 4) = 0;
    (this->axes).data = (void *)0x0;
    (this->axes).refcount = (int *)0x0;
    (this->axes).dims = 0;
    (this->axes).w = 0;
    (this->axes).h = 0;
    (this->axes).c = 0;
    (this->axes).cstep = 0;
    (this->axes).data = local_98.data;
    (this->axes).refcount = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    (this->axes).elemsize = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
    (this->axes).elempack = local_98.elempack;
    (this->axes).allocator = local_98.allocator;
    (this->axes).dims = local_98.dims;
    (this->axes).w = local_98.w;
    (this->axes).h = local_98.h;
    (this->axes).c = local_98.c;
    (this->axes).cstep = local_98.cstep;
  }
  piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (**(code **)(*(long *)local_98.allocator + 0x18))();
      }
    }
  }
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.c = 0;
  local_98.cstep = 0;
  piVar1 = (int *)CONCAT44(local_58.refcount._4_4_,local_58.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_58.allocator == (Allocator *)0x0) {
        if (local_58.data != (void *)0x0) {
          free(local_58.data);
        }
      }
      else {
        (**(code **)(*(long *)local_58.allocator + 0x18))();
      }
    }
  }
  return 0;
}

Assistant:

int ExpandDims::load_param(const ParamDict& pd)
{
    expand_w = pd.get(0, 0);
    expand_h = pd.get(1, 0);
    expand_c = pd.get(2, 0);
    axes = pd.get(3, Mat());

    return 0;
}